

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O1

int handle_signal(void)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  int es;
  signalfd_siginfo info;
  uint local_ac;
  int local_a8 [32];
  
  sVar3 = read(cfg.signal_fd,local_a8,0x80);
  if (sVar3 == 0x80) {
    if (local_a8[0] == 0xe) {
      iVar2 = cfg.ticks + 1;
      uVar1 = cfg.ticks * -0x33333333 + 0xe6666665;
      cfg.ticks = iVar2;
      if (((uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f) < 0x19999999) && (cfg.verbose != 0)) {
        fprintf(_stderr,"up %d seconds\n");
      }
      alarm(1);
    }
    else {
      if (local_a8[0] != 0x11) {
        fprintf(_stderr,"got signal %d\n");
        goto LAB_00101b2f;
      }
      uVar1 = waitpid(-1,(int *)&local_ac,1);
      if (0 < (int)uVar1) {
        do {
          if (0x1ffffff < (int)((local_ac & 0x7f) * 0x1000000 + 0x1000000)) {
            fprintf(_stderr,"pid %d exited: signal %d\n",(ulong)uVar1);
          }
          if ((local_ac & 0x7f) == 0) {
            fprintf(_stderr,"pid %d exited: status %d\n",(ulong)uVar1,(ulong)(local_ac >> 8 & 0xff))
            ;
          }
          uVar1 = waitpid(-1,(int *)&local_ac,1);
        } while (0 < (int)uVar1);
      }
    }
    iVar2 = 0;
  }
  else {
    handle_signal_cold_1();
LAB_00101b2f:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int handle_signal() {
  struct signalfd_siginfo info;
  int es, rc = -1;
  pid_t pid;

  if (read(cfg.signal_fd, &info, sizeof(info)) != sizeof(info)) {
    fprintf(stderr,"failed to read signal fd buffer\n");
    goto done;
  }

  switch (info.ssi_signo) {
    case SIGALRM: 
      if ((++cfg.ticks % 10) == 0) periodic(); 
      alarm(1); 
      break;
    case SIGCHLD:  /* collect children to avoid leaving zombie processes */
      while ( (pid = waitpid(-1, &es, WNOHANG)) > 0) {
        if (WIFSIGNALED(es)) {
          fprintf(stderr, "pid %d exited: signal %d\n", pid, (int)WTERMSIG(es));
        }
        if (WIFEXITED(es)) {
          fprintf(stderr, "pid %d exited: status %d\n", pid, (int)WEXITSTATUS(es));
        }
      }
      break;
    default:  /* exit */
      /* TODO on termination, signal forked processes */
      fprintf(stderr,"got signal %d\n", info.ssi_signo);  
      goto done;
  }

  rc = 0;

 done:
  return rc;
}